

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_vertical_6_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  __m128i *palVar28;
  undefined1 (*pauVar29) [16];
  undefined8 uVar30;
  undefined8 uVar31;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  long in_RDI;
  uint8_t *in_R8;
  uint8_t *in_R9;
  ushort uVar32;
  ulong uVar33;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar40;
  ushort uVar41;
  undefined1 auVar34 [16];
  ulong uVar39;
  ushort uVar42;
  undefined1 auVar43 [16];
  uint8_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  int in_stack_00000018;
  __m128i q2;
  __m128i p2;
  __m128i q1;
  __m128i p1;
  __m128i q0;
  __m128i p0;
  __m128i x7;
  __m128i x6;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i d7;
  __m128i d6;
  __m128i d5;
  __m128i d4;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i workp_shft1;
  __m128i workp_shft0;
  __m128i workp_b;
  __m128i workp_a;
  __m128i q [2];
  __m128i p_1 [2];
  __m128i qs [2];
  __m128i ps [2];
  __m128i ffff;
  __m128i one;
  __m128i four;
  __m128i oq1;
  __m128i oq0;
  __m128i op0;
  __m128i op1;
  __m128i abs_q2q1;
  __m128i abs_q1q0;
  __m128i abs_p2p1;
  __m128i abs_p1p0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i work;
  __m128i flat;
  __m128i mask;
  __m128i t80;
  __m128i thresh0;
  __m128i limit0;
  __m128i blimit0;
  __m128i zero;
  __m128i *x4_00;
  __m128i *x3_00;
  __m128i *x1_00;
  __m128i *d3_00;
  __m128i *d4_00;
  __m128i *d5_00;
  undefined4 in_stack_ffffffffffffeee0;
  undefined2 uVar44;
  undefined2 uVar45;
  __m128i *t80_out;
  __m128i *in_stack_ffffffffffffeef0;
  __m128i *in_stack_ffffffffffffeef8;
  __m128i *in_stack_ffffffffffffef00;
  __m128i *in_stack_ffffffffffffef08;
  __m128i *in_stack_ffffffffffffef10;
  __m128i *in_stack_ffffffffffffef18;
  __m128i *in_stack_ffffffffffffef20;
  __m128i *in_stack_ffffffffffffef28;
  __m128i *in_stack_ffffffffffffef30;
  __m128i *in_stack_ffffffffffffef38;
  __m128i *in_stack_ffffffffffffef40;
  __m128i *in_stack_ffffffffffffef48;
  longlong local_1028 [2];
  longlong local_1018 [2];
  longlong local_1008 [2];
  longlong local_ff8 [2];
  undefined8 local_fe8;
  undefined8 local_fd8;
  undefined8 local_fc8;
  undefined8 local_fb8;
  uint8_t *local_fa8;
  uint8_t *local_fa0;
  uint8_t *local_f98;
  uint8_t *local_f90;
  int local_f84;
  long local_f80;
  long local_e78;
  long local_e70;
  long local_e68;
  long local_e60;
  long local_e58;
  long local_e50;
  long local_e48;
  long local_e40;
  ushort local_e38;
  ushort uStack_e36;
  ushort uStack_e34;
  ushort uStack_e32;
  ushort uStack_e30;
  ushort uStack_e2e;
  ushort uStack_e2c;
  ushort uStack_e2a;
  ushort local_e28;
  ushort uStack_e26;
  ushort uStack_e24;
  ushort uStack_e22;
  ushort uStack_e20;
  ushort uStack_e1e;
  ushort uStack_e1c;
  ushort uStack_e1a;
  short local_e18;
  short sStack_e16;
  short sStack_e14;
  short sStack_e12;
  short sStack_e10;
  short sStack_e0e;
  short sStack_e0c;
  short sStack_e0a;
  short local_e08;
  short sStack_e06;
  short sStack_e04;
  short sStack_e02;
  short sStack_e00;
  short sStack_dfe;
  short sStack_dfc;
  short sStack_dfa;
  longlong local_df8;
  longlong lStack_df0;
  longlong local_de8;
  longlong lStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  ulong local_db8;
  ulong uStack_db0;
  ulong local_da8;
  ulong uStack_da0;
  ulong local_d98;
  ulong uStack_d90;
  uint local_d88;
  uint uStack_d84;
  uint uStack_d80;
  uint uStack_d7c;
  undefined2 local_d78;
  undefined2 uStack_d76;
  undefined2 uStack_d74;
  undefined2 uStack_d72;
  undefined2 uStack_d70;
  undefined2 uStack_d6e;
  undefined2 uStack_d6c;
  undefined2 uStack_d6a;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  ulong local_d08;
  ulong uStack_d00;
  ulong local_cf8;
  ulong uStack_cf0;
  ulong local_ce8;
  ulong uStack_ce0;
  ulong local_cd8;
  ulong uStack_cd0;
  undefined1 local_cc8 [16];
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  ushort local_ca8;
  ushort uStack_ca6;
  ushort uStack_ca4;
  ushort uStack_ca2;
  ushort uStack_ca0;
  ushort uStack_c9e;
  ushort uStack_c9c;
  ushort uStack_c9a;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  longlong local_c78 [2];
  longlong local_c68 [2];
  longlong local_c58;
  longlong lStack_c50;
  longlong local_c48;
  longlong lStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  int local_c1c;
  uint8_t *local_c08;
  uint8_t *local_c00;
  uint8_t *local_bf8;
  uint8_t *local_bf0;
  __m128i *local_be8;
  __m128i *local_be0;
  __m128i *local_bd8;
  undefined1 (*local_bd0) [16];
  undefined1 (*local_bc8) [16];
  undefined1 (*local_bc0) [16];
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  ulong local_ba8;
  ulong uStack_ba0;
  ulong local_b98;
  ulong uStack_b90;
  ulong local_b88;
  ulong uStack_b80;
  ulong local_b78;
  ulong uStack_b70;
  ulong local_b68;
  ulong uStack_b60;
  ulong local_b58;
  ulong uStack_b50;
  ulong local_b48;
  ulong uStack_b40;
  ulong local_b38;
  ulong uStack_b30;
  ulong local_b28;
  ulong uStack_b20;
  ulong local_b18;
  ulong uStack_b10;
  undefined1 local_b08 [16];
  ulong local_af8;
  ulong uStack_af0;
  short local_ae8;
  short sStack_ae6;
  short sStack_ae4;
  short sStack_ae2;
  short sStack_ae0;
  short sStack_ade;
  short sStack_adc;
  ushort uStack_ada;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined2 local_a2c;
  undefined2 local_a2a;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  longlong local_a08;
  longlong lStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  short local_978;
  short sStack_976;
  short sStack_974;
  short sStack_972;
  short sStack_970;
  short sStack_96e;
  short sStack_96c;
  short sStack_96a;
  longlong local_968;
  longlong lStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  short local_918;
  short sStack_916;
  short sStack_914;
  short sStack_912;
  short sStack_910;
  short sStack_90e;
  short sStack_90c;
  short sStack_90a;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  short local_8d8;
  short sStack_8d6;
  short sStack_8d4;
  short sStack_8d2;
  short sStack_8d0;
  short sStack_8ce;
  short sStack_8cc;
  short sStack_8ca;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  short local_8a8;
  short sStack_8a6;
  short sStack_8a4;
  short sStack_8a2;
  short sStack_8a0;
  short sStack_89e;
  short sStack_89c;
  short sStack_89a;
  short local_898;
  short sStack_896;
  short sStack_894;
  short sStack_892;
  short sStack_890;
  short sStack_88e;
  short sStack_88c;
  short sStack_88a;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  short local_838;
  short sStack_836;
  short sStack_834;
  short sStack_832;
  short sStack_830;
  short sStack_82e;
  short sStack_82c;
  short sStack_82a;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  short local_7f8;
  short sStack_7f6;
  short sStack_7f4;
  short sStack_7f2;
  short sStack_7f0;
  short sStack_7ee;
  short sStack_7ec;
  short sStack_7ea;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  int in_stack_fffffffffffff840;
  __m128i *in_stack_fffffffffffff848;
  ushort local_738;
  ushort uStack_736;
  ushort uStack_734;
  ushort uStack_732;
  ushort uStack_730;
  ushort uStack_72e;
  ushort uStack_72c;
  ushort uStack_72a;
  uint local_718;
  uint uStack_714;
  uint uStack_710;
  uint uStack_70c;
  ulong local_5e8;
  ulong uStack_5e0;
  ulong local_5d8;
  ulong uStack_5d0;
  ulong local_5a8;
  ulong uStack_5a0;
  ulong local_598;
  ulong uStack_590;
  ulong local_568;
  ulong uStack_560;
  ulong local_558;
  ulong uStack_550;
  ulong local_528;
  ulong uStack_520;
  ulong local_518;
  ulong uStack_510;
  ulong local_4e8;
  ulong uStack_4e0;
  ulong local_4d8;
  ulong uStack_4d0;
  ulong local_4a8;
  ulong uStack_4a0;
  ulong local_498;
  ulong uStack_490;
  ulong local_468;
  ulong uStack_460;
  ulong local_458;
  ulong uStack_450;
  ulong local_428;
  ulong uStack_420;
  ulong local_418;
  ulong uStack_410;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  
  d3_00 = (__m128i *)&stack0xffffffffffffee78;
  local_e40 = in_RDI + -6;
  local_e48 = in_RDI + -6 + (long)in_ESI * 2;
  local_e50 = in_RDI + -6 + (long)(in_ESI * 2) * 2;
  local_e58 = in_RDI + -6 + (long)(in_ESI * 3) * 2;
  local_e60 = in_RDI + -6 + (long)(in_ESI << 2) * 2;
  local_e68 = in_RDI + -6 + (long)(in_ESI * 5) * 2;
  local_e70 = in_RDI + -6 + (long)(in_ESI * 6) * 2;
  local_e78 = in_RDI + -6 + (long)(in_ESI * 7) * 2;
  x1_00 = &local_1028;
  x3_00 = (__m128i *)&stack0xffffffffffffeef8;
  x4_00 = (__m128i *)&stack0xffffffffffffef18;
  d4_00 = x4_00;
  d5_00 = x3_00;
  local_fa8 = in_R9;
  local_fa0 = in_R8;
  local_f98 = in_RCX;
  local_f90 = in_RDX;
  local_f84 = in_ESI;
  local_f80 = in_RDI;
  highbd_transpose8x8_sse2
            ((__m128i *)&stack0xffffffffffffee78,x1_00,&local_1018,x3_00,x4_00,
             (__m128i *)&stack0xffffffffffffef38,in_stack_ffffffffffffeef0,in_stack_ffffffffffffeef8
             ,in_stack_ffffffffffffef00,in_stack_ffffffffffffef08,in_stack_ffffffffffffef10,
             in_stack_ffffffffffffef18,in_stack_ffffffffffffef20,in_stack_ffffffffffffef28,
             in_stack_ffffffffffffef30,in_stack_ffffffffffffef38);
  local_bf0 = local_f90;
  local_bf8 = local_f98;
  local_c00 = local_fa0;
  local_c08 = local_fa8;
  local_c1c = in_stack_00000018;
  local_bb8 = 0;
  uStack_bb0 = 0;
  local_c38 = 0;
  uStack_c30 = 0;
  local_a2a = 4;
  uVar44 = 4;
  local_d58 = 0x4000400040004;
  uStack_d50 = 0x4000400040004;
  local_a2c = 1;
  uVar45 = 1;
  local_d68 = 0x1000100010001;
  uStack_d60 = 0x1000100010001;
  local_d78 = 0xffff;
  uStack_d76 = 0xffff;
  uStack_d74 = 0xffff;
  uStack_d72 = 0xffff;
  uStack_d70 = 0xffff;
  uStack_d6e = 0xffff;
  uStack_d6c = 0xffff;
  uStack_d6a = 0xffff;
  t80_out = &local_c78;
  local_be8 = d5_00;
  local_be0 = d4_00;
  local_bd8 = (__m128i *)&stack0xffffffffffffef38;
  local_bd0 = (undefined1 (*) [16])&stack0xffffffffffffef48;
  local_bc8 = (undefined1 (*) [16])&stack0xffffffffffffef28;
  local_bc0 = (undefined1 (*) [16])&stack0xffffffffffffef08;
  local_a58 = local_d68;
  uStack_a50 = uStack_d60;
  local_a48 = local_d68;
  uStack_a40 = uStack_d60;
  get_limit_dual(local_f90,local_f98,local_fa0,local_fa8,in_stack_00000008,in_stack_00000010,
                 in_stack_00000018,(__m128i *)&local_c48,(__m128i *)&local_c58,&local_c68,t80_out);
  auVar43 = psubusw(*local_bc0,*local_bc8);
  auVar34 = psubusw(*local_bc8,*local_bc0);
  local_418 = auVar43._0_8_;
  uStack_410 = auVar43._8_8_;
  local_428 = auVar34._0_8_;
  uStack_420 = auVar34._8_8_;
  local_ce8 = local_418 | local_428;
  uStack_ce0 = uStack_410 | uStack_420;
  auVar43 = psubusw(*local_bc8,*local_bd0);
  auVar34 = psubusw(*local_bd0,*local_bc8);
  local_458 = auVar43._0_8_;
  uStack_450 = auVar43._8_8_;
  local_468 = auVar34._0_8_;
  uStack_460 = auVar34._8_8_;
  local_cd8 = local_458 | local_468;
  uStack_cd0 = uStack_450 | uStack_460;
  auVar43 = psubusw((undefined1  [16])*local_be0,(undefined1  [16])*local_bd8);
  auVar34 = psubusw((undefined1  [16])*local_bd8,(undefined1  [16])*local_be0);
  local_498 = auVar43._0_8_;
  uStack_490 = auVar43._8_8_;
  local_4a8 = auVar34._0_8_;
  uStack_4a0 = auVar34._8_8_;
  local_cf8 = local_498 | local_4a8;
  uStack_cf0 = uStack_490 | uStack_4a0;
  auVar43 = psubusw((undefined1  [16])*local_be8,(undefined1  [16])*local_be0);
  auVar34 = psubusw((undefined1  [16])*local_be0,(undefined1  [16])*local_be8);
  local_4d8 = auVar43._0_8_;
  uStack_4d0 = auVar43._8_8_;
  local_4e8 = auVar34._0_8_;
  uStack_4e0 = auVar34._8_8_;
  local_d08 = local_4d8 | local_4e8;
  uStack_d00 = uStack_4d0 | uStack_4e0;
  auVar43 = psubusw(*local_bd0,(undefined1  [16])*local_bd8);
  auVar34 = psubusw((undefined1  [16])*local_bd8,*local_bd0);
  local_518 = auVar43._0_8_;
  uStack_510 = auVar43._8_8_;
  local_528 = auVar34._0_8_;
  uStack_520 = auVar34._8_8_;
  auVar43 = psubusw(*local_bc8,(undefined1  [16])*local_be0);
  auVar34 = psubusw((undefined1  [16])*local_be0,*local_bc8);
  local_558 = auVar43._0_8_;
  uStack_550 = auVar43._8_8_;
  local_568 = auVar34._0_8_;
  uStack_560 = auVar34._8_8_;
  local_558 = local_558 | local_568;
  uStack_550 = uStack_550 | uStack_560;
  auVar23._8_8_ = uStack_510 | uStack_520;
  auVar23._0_8_ = local_518 | local_528;
  auVar22._8_8_ = uStack_510 | uStack_520;
  auVar22._0_8_ = local_518 | local_528;
  local_cc8 = paddusw(auVar23,auVar22);
  local_738 = (ushort)local_558;
  uStack_736 = (ushort)(local_558 >> 0x10);
  uStack_734 = (ushort)(local_558 >> 0x20);
  uStack_730 = (ushort)uStack_550;
  uStack_72e = (ushort)(uStack_550 >> 0x10);
  uStack_72c = (ushort)(uStack_550 >> 0x20);
  local_cb8 = CONCAT26((ushort)(local_558 >> 0x31),
                       CONCAT24(uStack_734 >> 1,CONCAT22(uStack_736 >> 1,local_738 >> 1)));
  uStack_cb0 = CONCAT26((ushort)(uStack_550 >> 0x31),
                        CONCAT24(uStack_72c >> 1,CONCAT22(uStack_72e >> 1,uStack_730 >> 1)));
  auVar21._8_8_ = uStack_cb0;
  auVar21._0_8_ = local_cb8;
  auVar34 = paddusw(local_cc8,auVar21);
  auVar27._8_8_ = lStack_c40;
  auVar27._0_8_ = local_c48;
  auVar34 = psubusw(auVar34,auVar27);
  local_c88 = auVar34._0_8_;
  uStack_c80 = auVar34._8_8_;
  local_a68 = local_c88;
  uVar9 = local_a68;
  uStack_a60 = uStack_c80;
  uVar10 = uStack_a60;
  local_a78 = local_c38;
  uVar7 = local_a78;
  uStack_a70 = uStack_c30;
  uVar8 = uStack_a70;
  local_a68._0_2_ = auVar34._0_2_;
  local_a68._2_2_ = auVar34._2_2_;
  local_a68._4_2_ = auVar34._4_2_;
  local_a68._6_2_ = auVar34._6_2_;
  uStack_a60._0_2_ = auVar34._8_2_;
  uStack_a60._2_2_ = auVar34._10_2_;
  uStack_a60._4_2_ = auVar34._12_2_;
  uStack_a60._6_2_ = auVar34._14_2_;
  local_a78._0_2_ = (short)local_c38;
  local_a78._2_2_ = (short)((ulong)local_c38 >> 0x10);
  local_a78._4_2_ = (short)((ulong)local_c38 >> 0x20);
  local_a78._6_2_ = (short)((ulong)local_c38 >> 0x30);
  uStack_a70._0_2_ = (short)uStack_c30;
  uStack_a70._2_2_ = (short)((ulong)uStack_c30 >> 0x10);
  uStack_a70._4_2_ = (short)((ulong)uStack_c30 >> 0x20);
  uStack_a70._6_2_ = (short)((ulong)uStack_c30 >> 0x30);
  local_af8 = CONCAT26(-(ushort)(local_a68._6_2_ == local_a78._6_2_),
                       CONCAT24(-(ushort)(local_a68._4_2_ == local_a78._4_2_),
                                CONCAT22(-(ushort)(local_a68._2_2_ == local_a78._2_2_),
                                         -(ushort)((short)local_a68 == (short)local_a78)))) ^
              CONCAT26(uStack_d72,CONCAT24(uStack_d74,CONCAT22(uStack_d76,local_d78)));
  uStack_af0 = CONCAT26(-(ushort)(uStack_a60._6_2_ == uStack_a70._6_2_),
                        CONCAT24(-(ushort)(uStack_a60._4_2_ == uStack_a70._4_2_),
                                 CONCAT22(-(ushort)(uStack_a60._2_2_ == uStack_a70._2_2_),
                                          -(ushort)((short)uStack_a60 == (short)uStack_a70)))) ^
               CONCAT26(uStack_d6a,CONCAT24(uStack_d6c,CONCAT22(uStack_d6e,uStack_d70)));
  auVar20._8_8_ = lStack_c50;
  auVar20._0_8_ = local_c58;
  auVar19._8_8_ = uStack_d60;
  auVar19._0_8_ = local_d68;
  local_b08 = paddusw(auVar20,auVar19);
  uVar33 = local_af8 & local_b08._0_8_;
  uVar39 = uStack_af0 & local_b08._8_8_;
  local_78 = (short)local_d08;
  sStack_76 = (short)(local_d08 >> 0x10);
  sStack_74 = (short)(local_d08 >> 0x20);
  sStack_72 = (short)(local_d08 >> 0x30);
  sStack_70 = (short)uStack_d00;
  sStack_6e = (short)(uStack_d00 >> 0x10);
  sStack_6c = (short)(uStack_d00 >> 0x20);
  sStack_6a = (short)(uStack_d00 >> 0x30);
  local_88 = (short)uVar33;
  sStack_86 = (short)(uVar33 >> 0x10);
  sStack_84 = (short)(uVar33 >> 0x20);
  sStack_82 = (short)(uVar33 >> 0x30);
  sStack_80 = (short)uVar39;
  sStack_7e = (short)(uVar39 >> 0x10);
  sStack_7c = (short)(uVar39 >> 0x20);
  sStack_7a = (short)(uVar39 >> 0x30);
  uVar32 = (ushort)(local_78 < local_88) * local_88 | (ushort)(local_78 >= local_88) * local_78;
  uVar35 = (ushort)(sStack_76 < sStack_86) * sStack_86 |
           (ushort)(sStack_76 >= sStack_86) * sStack_76;
  uVar36 = (ushort)(sStack_74 < sStack_84) * sStack_84 |
           (ushort)(sStack_74 >= sStack_84) * sStack_74;
  uVar37 = (ushort)(sStack_72 < sStack_82) * sStack_82 |
           (ushort)(sStack_72 >= sStack_82) * sStack_72;
  uVar38 = (ushort)(sStack_70 < sStack_80) * sStack_80 |
           (ushort)(sStack_70 >= sStack_80) * sStack_70;
  uVar40 = (ushort)(sStack_6e < sStack_7e) * sStack_7e |
           (ushort)(sStack_6e >= sStack_7e) * sStack_6e;
  uVar41 = (ushort)(sStack_6c < sStack_7c) * sStack_7c |
           (ushort)(sStack_6c >= sStack_7c) * sStack_6c;
  uVar42 = (ushort)(sStack_6a < sStack_7a) * sStack_7a |
           (ushort)(sStack_6a >= sStack_7a) * sStack_6a;
  local_98 = (short)local_cd8;
  sStack_96 = (short)(local_cd8 >> 0x10);
  sStack_94 = (short)(local_cd8 >> 0x20);
  sStack_92 = (short)(local_cd8 >> 0x30);
  sStack_90 = (short)uStack_cd0;
  sStack_8e = (short)(uStack_cd0 >> 0x10);
  sStack_8c = (short)(uStack_cd0 >> 0x20);
  sStack_8a = (short)(uStack_cd0 >> 0x30);
  local_a8 = (short)local_cf8;
  sStack_a6 = (short)(local_cf8 >> 0x10);
  sStack_a4 = (short)(local_cf8 >> 0x20);
  sStack_a2 = (short)(local_cf8 >> 0x30);
  sStack_a0 = (short)uStack_cf0;
  sStack_9e = (short)(uStack_cf0 >> 0x10);
  sStack_9c = (short)(uStack_cf0 >> 0x20);
  sStack_9a = (short)(uStack_cf0 >> 0x30);
  local_ca8 = (ushort)(local_98 < local_a8) * local_a8 | (ushort)(local_98 >= local_a8) * local_98;
  uStack_ca6 = (ushort)(sStack_96 < sStack_a6) * sStack_a6 |
               (ushort)(sStack_96 >= sStack_a6) * sStack_96;
  uStack_ca4 = (ushort)(sStack_94 < sStack_a4) * sStack_a4 |
               (ushort)(sStack_94 >= sStack_a4) * sStack_94;
  uStack_ca2 = (ushort)(sStack_92 < sStack_a2) * sStack_a2 |
               (ushort)(sStack_92 >= sStack_a2) * sStack_92;
  uStack_ca0 = (ushort)(sStack_90 < sStack_a0) * sStack_a0 |
               (ushort)(sStack_90 >= sStack_a0) * sStack_90;
  uStack_c9e = (ushort)(sStack_8e < sStack_9e) * sStack_9e |
               (ushort)(sStack_8e >= sStack_9e) * sStack_8e;
  uStack_c9c = (ushort)(sStack_8c < sStack_9c) * sStack_9c |
               (ushort)(sStack_8c >= sStack_9c) * sStack_8c;
  uStack_c9a = (ushort)(sStack_8a < sStack_9a) * sStack_9a |
               (ushort)(sStack_8a >= sStack_9a) * sStack_8a;
  uVar32 = ((short)local_ca8 < (short)uVar32) * uVar32 |
           ((short)local_ca8 >= (short)uVar32) * local_ca8;
  uVar35 = ((short)uStack_ca6 < (short)uVar35) * uVar35 |
           ((short)uStack_ca6 >= (short)uVar35) * uStack_ca6;
  uVar36 = ((short)uStack_ca4 < (short)uVar36) * uVar36 |
           ((short)uStack_ca4 >= (short)uVar36) * uStack_ca4;
  uVar37 = ((short)uStack_ca2 < (short)uVar37) * uVar37 |
           ((short)uStack_ca2 >= (short)uVar37) * uStack_ca2;
  uVar38 = ((short)uStack_ca0 < (short)uVar38) * uVar38 |
           ((short)uStack_ca0 >= (short)uVar38) * uStack_ca0;
  uVar40 = ((short)uStack_c9e < (short)uVar40) * uVar40 |
           ((short)uStack_c9e >= (short)uVar40) * uStack_c9e;
  uVar41 = ((short)uStack_c9c < (short)uVar41) * uVar41 |
           ((short)uStack_c9c >= (short)uVar41) * uStack_c9c;
  uVar42 = ((short)uStack_c9a < (short)uVar42) * uVar42 |
           ((short)uStack_c9a >= (short)uVar42) * uStack_c9a;
  local_e8 = (short)local_ce8;
  sStack_e6 = (short)(local_ce8 >> 0x10);
  sStack_e4 = (short)(local_ce8 >> 0x20);
  sStack_e2 = (short)(local_ce8 >> 0x30);
  sStack_e0 = (short)uStack_ce0;
  sStack_de = (short)(uStack_ce0 >> 0x10);
  sStack_dc = (short)(uStack_ce0 >> 0x20);
  sStack_da = (short)(uStack_ce0 >> 0x30);
  local_c88._0_4_ =
       CONCAT22((ushort)((short)uVar35 < sStack_e6) * sStack_e6 |
                ((short)uVar35 >= sStack_e6) * uVar35,
                (ushort)((short)uVar32 < local_e8) * local_e8 | ((short)uVar32 >= local_e8) * uVar32
               );
  local_c88._0_6_ =
       CONCAT24((ushort)((short)uVar36 < sStack_e4) * sStack_e4 |
                ((short)uVar36 >= sStack_e4) * uVar36,(undefined4)local_c88);
  local_c88 = CONCAT26((ushort)((short)uVar37 < sStack_e2) * sStack_e2 |
                       ((short)uVar37 >= sStack_e2) * uVar37,(undefined6)local_c88);
  uStack_c80._0_2_ =
       (ushort)((short)uVar38 < sStack_e0) * sStack_e0 | ((short)uVar38 >= sStack_e0) * uVar38;
  uStack_c80._2_2_ =
       (ushort)((short)uVar40 < sStack_de) * sStack_de | ((short)uVar40 >= sStack_de) * uVar40;
  uStack_c80._4_2_ =
       (ushort)((short)uVar41 < sStack_dc) * sStack_dc | ((short)uVar41 >= sStack_dc) * uVar41;
  uStack_c80._6_2_ =
       (ushort)((short)uVar42 < sStack_da) * sStack_da | ((short)uVar42 >= sStack_da) * uVar42;
  auVar26._8_8_ = uStack_c80;
  auVar26._0_8_ = local_c88;
  auVar25._8_8_ = lStack_c50;
  auVar25._0_8_ = local_c58;
  auVar34 = psubusw(auVar26,auVar25);
  local_c88 = auVar34._0_8_;
  uStack_c80 = auVar34._8_8_;
  local_a88 = local_c88;
  uVar1 = local_a88;
  uStack_a80 = uStack_c80;
  uVar2 = uStack_a80;
  local_a98 = local_c38;
  uStack_a90 = uStack_c30;
  local_a88._0_2_ = auVar34._0_2_;
  local_a88._2_2_ = auVar34._2_2_;
  local_a88._4_2_ = auVar34._4_2_;
  local_a88._6_2_ = auVar34._6_2_;
  uStack_a80._0_2_ = auVar34._8_2_;
  uStack_a80._2_2_ = auVar34._10_2_;
  uStack_a80._4_2_ = auVar34._12_2_;
  uStack_a80._6_2_ = auVar34._14_2_;
  local_c88._2_2_ = -(ushort)(local_a88._2_2_ == local_a78._2_2_);
  local_c88._0_2_ = -(ushort)((short)local_a88 == (short)local_a78);
  local_c88._4_2_ = -(ushort)(local_a88._4_2_ == local_a78._4_2_);
  local_c88._6_2_ = -(ushort)(local_a88._6_2_ == local_a78._6_2_);
  uStack_c80._0_2_ = -(ushort)((short)uStack_a80 == (short)uStack_a70);
  uStack_c80._2_2_ = -(ushort)(uStack_a80._2_2_ == uStack_a70._2_2_);
  uStack_c80._4_2_ = -(ushort)(uStack_a80._4_2_ == uStack_a70._4_2_);
  uStack_c80._6_2_ = -(ushort)(uStack_a80._6_2_ == uStack_a70._6_2_);
  local_dd8 = *(undefined8 *)*local_bd0;
  uStack_dd0 = *(undefined8 *)(*local_bd0 + 8);
  local_dc8 = *(undefined8 *)*local_bc8;
  uStack_dc0 = *(undefined8 *)(*local_bc8 + 8);
  local_df8 = (*local_bd8)[0];
  lStack_df0 = (*local_bd8)[1];
  local_de8 = (*local_be0)[0];
  lStack_de0 = (*local_be0)[1];
  local_a88 = uVar1;
  uStack_a80 = uVar2;
  local_a78 = uVar7;
  uStack_a70 = uVar8;
  local_a68 = uVar9;
  uStack_a60 = uVar10;
  highbd_filter4_dual_sse2
            (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
             in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,
             in_stack_fffffffffffff840,in_stack_fffffffffffff848);
  palVar28 = local_bd8;
  uVar33 = uStack_db0;
  auVar43 = psubusw((undefined1  [16])*local_be8,(undefined1  [16])*local_bd8);
  auVar34 = psubusw((undefined1  [16])*local_bd8,(undefined1  [16])*local_be8);
  local_598 = auVar43._0_8_;
  uStack_590 = auVar43._8_8_;
  local_5a8 = auVar34._0_8_;
  uStack_5a0 = auVar34._8_8_;
  local_598 = local_598 | local_5a8;
  uStack_590 = uStack_590 | uStack_5a0;
  auVar43 = psubusw(*local_bc0,*local_bd0);
  auVar34 = psubusw(*local_bd0,*local_bc0);
  local_5d8 = auVar43._0_8_;
  uStack_5d0 = auVar43._8_8_;
  local_5e8 = auVar34._0_8_;
  uStack_5e0 = auVar34._8_8_;
  local_5d8 = local_5d8 | local_5e8;
  uStack_5d0 = uStack_5d0 | uStack_5e0;
  local_f8 = (short)local_598;
  sStack_f6 = (short)(local_598 >> 0x10);
  sStack_f4 = (short)(local_598 >> 0x20);
  sStack_f2 = (short)(local_598 >> 0x30);
  sStack_f0 = (short)uStack_590;
  sStack_ee = (short)(uStack_590 >> 0x10);
  sStack_ec = (short)(uStack_590 >> 0x20);
  sStack_ea = (short)(uStack_590 >> 0x30);
  local_108 = (short)local_5d8;
  sStack_106 = (short)(local_5d8 >> 0x10);
  sStack_104 = (short)(local_5d8 >> 0x20);
  sStack_102 = (short)(local_5d8 >> 0x30);
  sStack_100 = (short)uStack_5d0;
  sStack_fe = (short)(uStack_5d0 >> 0x10);
  sStack_fc = (short)(uStack_5d0 >> 0x20);
  sStack_fa = (short)(uStack_5d0 >> 0x30);
  uVar32 = (ushort)(local_f8 < local_108) * local_108 | (ushort)(local_f8 >= local_108) * local_f8;
  uVar35 = (ushort)(sStack_f6 < sStack_106) * sStack_106 |
           (ushort)(sStack_f6 >= sStack_106) * sStack_f6;
  uVar36 = (ushort)(sStack_f4 < sStack_104) * sStack_104 |
           (ushort)(sStack_f4 >= sStack_104) * sStack_f4;
  uVar37 = (ushort)(sStack_f2 < sStack_102) * sStack_102 |
           (ushort)(sStack_f2 >= sStack_102) * sStack_f2;
  uVar38 = (ushort)(sStack_f0 < sStack_100) * sStack_100 |
           (ushort)(sStack_f0 >= sStack_100) * sStack_f0;
  uVar40 = (ushort)(sStack_ee < sStack_fe) * sStack_fe |
           (ushort)(sStack_ee >= sStack_fe) * sStack_ee;
  uVar41 = (ushort)(sStack_ec < sStack_fc) * sStack_fc |
           (ushort)(sStack_ec >= sStack_fc) * sStack_ec;
  uVar42 = (ushort)(sStack_ea < sStack_fa) * sStack_fa |
           (ushort)(sStack_ea >= sStack_fa) * sStack_ea;
  local_c98._0_4_ =
       CONCAT22(((short)uVar35 < (short)uStack_ca6) * uStack_ca6 |
                ((short)uVar35 >= (short)uStack_ca6) * uVar35,
                ((short)uVar32 < (short)local_ca8) * local_ca8 |
                ((short)uVar32 >= (short)local_ca8) * uVar32);
  local_c98._0_6_ =
       CONCAT24(((short)uVar36 < (short)uStack_ca4) * uStack_ca4 |
                ((short)uVar36 >= (short)uStack_ca4) * uVar36,(undefined4)local_c98);
  local_c98 = CONCAT26(((short)uVar37 < (short)uStack_ca2) * uStack_ca2 |
                       ((short)uVar37 >= (short)uStack_ca2) * uVar37,(undefined6)local_c98);
  uStack_c90._0_2_ =
       ((short)uVar38 < (short)uStack_ca0) * uStack_ca0 |
       ((short)uVar38 >= (short)uStack_ca0) * uVar38;
  uStack_c90._2_2_ =
       ((short)uVar40 < (short)uStack_c9e) * uStack_c9e |
       ((short)uVar40 >= (short)uStack_c9e) * uVar40;
  uStack_c90._4_2_ =
       ((short)uVar41 < (short)uStack_c9c) * uStack_c9c |
       ((short)uVar41 >= (short)uStack_c9c) * uVar41;
  uStack_c90._6_2_ =
       ((short)uVar42 < (short)uStack_c9a) * uStack_c9a |
       ((short)uVar42 >= (short)uStack_c9a) * uVar42;
  auVar43._8_8_ = uStack_d60;
  auVar43._0_8_ = local_d68;
  auVar34 = psllw(auVar43,ZEXT416(local_c1c - 8));
  auVar24._8_8_ = uStack_c90;
  auVar24._0_8_ = local_c98;
  auVar34 = psubusw(auVar24,auVar34);
  local_c98 = auVar34._0_8_;
  uStack_c90 = auVar34._8_8_;
  local_aa8 = local_c98;
  uVar7 = local_aa8;
  uStack_aa0 = uStack_c90;
  uVar8 = uStack_aa0;
  local_ab8 = local_c38;
  uVar1 = local_ab8;
  uStack_ab0 = uStack_c30;
  uVar2 = uStack_ab0;
  local_aa8._0_2_ = auVar34._0_2_;
  local_aa8._2_2_ = auVar34._2_2_;
  local_aa8._4_2_ = auVar34._4_2_;
  local_aa8._6_2_ = auVar34._6_2_;
  uStack_aa0._0_2_ = auVar34._8_2_;
  uStack_aa0._2_2_ = auVar34._10_2_;
  uStack_aa0._4_2_ = auVar34._12_2_;
  uStack_aa0._6_2_ = auVar34._14_2_;
  local_ab8._0_2_ = (short)local_c38;
  local_ab8._2_2_ = (short)((ulong)local_c38 >> 0x10);
  local_ab8._4_2_ = (short)((ulong)local_c38 >> 0x20);
  local_ab8._6_2_ = (short)((ulong)local_c38 >> 0x30);
  uStack_ab0._0_2_ = (short)uStack_c30;
  uStack_ab0._2_2_ = (short)((ulong)uStack_c30 >> 0x10);
  uStack_ab0._4_2_ = (short)((ulong)uStack_c30 >> 0x20);
  uStack_ab0._6_2_ = (short)((ulong)uStack_c30 >> 0x30);
  local_c98._0_4_ =
       CONCAT22(-(ushort)(local_aa8._2_2_ == local_ab8._2_2_),
                -(ushort)((short)local_aa8 == (short)local_ab8));
  local_c98._0_6_ = CONCAT24(-(ushort)(local_aa8._4_2_ == local_ab8._4_2_),(undefined4)local_c98);
  local_c98 = CONCAT26(-(ushort)(local_aa8._6_2_ == local_ab8._6_2_),(undefined6)local_c98);
  uStack_c90._0_2_ = -(ushort)((short)uStack_aa0 == (short)uStack_ab0);
  uStack_c90._2_2_ = -(ushort)(uStack_aa0._2_2_ == uStack_ab0._2_2_);
  uStack_c90._4_2_ = -(ushort)(uStack_aa0._4_2_ == uStack_ab0._4_2_);
  uStack_c90._6_2_ = -(ushort)(uStack_aa0._6_2_ == uStack_ab0._6_2_);
  local_b18 = local_c98;
  uStack_b10 = uStack_c90;
  local_b28 = local_c88;
  uStack_b20 = uStack_c80;
  local_c98 = local_c98 & local_c88;
  uStack_c90 = uStack_c90 & uStack_c80;
  local_ad8 = local_c38;
  uStack_ad0 = uStack_c30;
  local_ac8._0_2_ = (short)local_c98;
  local_ac8._2_2_ = (short)(local_c98 >> 0x10);
  local_ac8._4_2_ = (short)(local_c98 >> 0x20);
  local_ac8._6_2_ = (short)(local_c98 >> 0x30);
  uStack_ac0._0_2_ = (short)uStack_c90;
  uStack_ac0._2_2_ = (short)(uStack_c90 >> 0x10);
  uStack_ac0._4_2_ = (short)(uStack_c90 >> 0x20);
  uStack_ac0._6_2_ = (short)(uStack_c90 >> 0x30);
  local_ae8 = -(ushort)((short)local_ac8 == (short)local_ab8);
  sStack_ae6 = -(ushort)(local_ac8._2_2_ == local_ab8._2_2_);
  sStack_ae4 = -(ushort)(local_ac8._4_2_ == local_ab8._4_2_);
  sStack_ae2 = -(ushort)(local_ac8._6_2_ == local_ab8._6_2_);
  sStack_ae0 = -(ushort)((short)uStack_ac0 == (short)uStack_ab0);
  sStack_ade = -(ushort)(uStack_ac0._2_2_ == uStack_ab0._2_2_);
  sStack_adc = -(ushort)(uStack_ac0._4_2_ == uStack_ab0._4_2_);
  uStack_ada = -(ushort)(uStack_ac0._6_2_ == uStack_ab0._6_2_);
  auVar34._2_2_ = sStack_ae6;
  auVar34._0_2_ = local_ae8;
  auVar34._4_2_ = sStack_ae4;
  auVar34._6_2_ = sStack_ae2;
  auVar34._8_2_ = sStack_ae0;
  auVar34._10_2_ = sStack_ade;
  auVar34._12_2_ = sStack_adc;
  auVar34._14_2_ = uStack_ada;
  local_ac8 = local_c98;
  uStack_ac0 = uStack_c90;
  local_ab8 = uVar1;
  uStack_ab0 = uVar2;
  local_aa8 = uVar7;
  uStack_aa0 = uVar8;
  if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(uStack_ada >> 7) & 1) << 0xe | uStack_ada & 0x8000) == 0xffff) {
    (*local_bd8)[0] = local_db8;
    (*palVar28)[1] = uVar33;
    palVar28 = local_be0;
    uVar33 = uStack_da0;
    (*local_be0)[0] = local_da8;
    (*palVar28)[1] = uVar33;
    pauVar29 = local_bd0;
    uVar33 = uStack_d90;
    *(ulong *)*local_bd0 = local_d98;
    *(ulong *)(*pauVar29 + 8) = uVar33;
    pauVar29 = local_bc8;
    uVar1 = CONCAT44(uStack_d7c,uStack_d80);
    *(ulong *)*local_bc8 = CONCAT44(uStack_d84,local_d88);
    *(undefined8 *)(*pauVar29 + 8) = uVar1;
  }
  else {
    local_868 = *(undefined8 *)*local_bd0;
    uStack_860 = *(undefined8 *)(*local_bd0 + 8);
    local_858._0_2_ = (short)local_868;
    local_858._2_2_ = (short)((ulong)local_868 >> 0x10);
    local_858._4_2_ = (short)((ulong)local_868 >> 0x20);
    local_858._6_2_ = (short)((ulong)local_868 >> 0x30);
    uStack_850._0_2_ = (short)uStack_860;
    uStack_850._2_2_ = (short)((ulong)uStack_860 >> 0x10);
    uStack_850._4_2_ = (short)((ulong)uStack_860 >> 0x20);
    uStack_850._6_2_ = (short)((ulong)uStack_860 >> 0x30);
    local_898 = (short)local_858 * 2;
    sStack_896 = local_858._2_2_ * 2;
    sStack_894 = local_858._4_2_ * 2;
    sStack_892 = local_858._6_2_ * 2;
    sStack_890 = (short)uStack_850 * 2;
    sStack_88e = uStack_850._2_2_ * 2;
    sStack_88c = uStack_850._4_2_ * 2;
    sStack_88a = uStack_850._6_2_ * 2;
    local_888 = *(undefined8 *)*local_bc8;
    uStack_880 = *(undefined8 *)(*local_bc8 + 8);
    local_878._0_2_ = (short)local_888;
    local_878._2_2_ = (short)((ulong)local_888 >> 0x10);
    local_878._4_2_ = (short)((ulong)local_888 >> 0x20);
    local_878._6_2_ = (short)((ulong)local_888 >> 0x30);
    uStack_870._0_2_ = (short)uStack_880;
    uStack_870._2_2_ = (short)((ulong)uStack_880 >> 0x10);
    uStack_870._4_2_ = (short)((ulong)uStack_880 >> 0x20);
    uStack_870._6_2_ = (short)((ulong)uStack_880 >> 0x30);
    local_8a8 = (short)local_878 * 2;
    sStack_8a6 = local_878._2_2_ * 2;
    sStack_8a4 = local_878._4_2_ * 2;
    sStack_8a2 = local_878._6_2_ * 2;
    sStack_8a0 = (short)uStack_870 * 2;
    sStack_89e = uStack_870._2_2_ * 2;
    sStack_89c = uStack_870._4_2_ * 2;
    sStack_89a = uStack_870._6_2_ * 2;
    local_8b8 = CONCAT26(sStack_892 + sStack_8a2,
                         CONCAT24(sStack_894 + sStack_8a4,
                                  CONCAT22(sStack_896 + sStack_8a6,local_898 + local_8a8)));
    uStack_8b0 = CONCAT26(sStack_88a + sStack_89a,
                          CONCAT24(sStack_88c + sStack_89c,
                                   CONCAT22(sStack_88e + sStack_89e,sStack_890 + sStack_8a0)));
    local_8c8 = local_d58;
    uVar30 = local_8c8;
    uStack_8c0 = uStack_d50;
    uVar31 = uStack_8c0;
    local_8c8._0_2_ = (short)local_d58;
    local_8c8._2_2_ = (short)((ulong)local_d58 >> 0x10);
    local_8c8._4_2_ = (short)((ulong)local_d58 >> 0x20);
    local_8c8._6_2_ = (short)((ulong)local_d58 >> 0x30);
    uStack_8c0._0_2_ = (short)uStack_d50;
    uStack_8c0._2_2_ = (short)((ulong)uStack_d50 >> 0x10);
    uStack_8c0._4_2_ = (short)((ulong)uStack_d50 >> 0x20);
    uStack_8c0._6_2_ = (short)((ulong)uStack_d50 >> 0x30);
    local_8d8 = local_898 + local_8a8 + (short)local_8c8;
    sStack_8d6 = sStack_896 + sStack_8a6 + local_8c8._2_2_;
    sStack_8d4 = sStack_894 + sStack_8a4 + local_8c8._4_2_;
    sStack_8d2 = sStack_892 + sStack_8a2 + local_8c8._6_2_;
    sStack_8d0 = sStack_890 + sStack_8a0 + (short)uStack_8c0;
    sStack_8ce = sStack_88e + sStack_89e + uStack_8c0._2_2_;
    sStack_8cc = sStack_88c + sStack_89c + uStack_8c0._4_2_;
    sStack_8ca = sStack_88a + sStack_89a + uStack_8c0._6_2_;
    uVar1 = *(undefined8 *)*local_bc0;
    uVar2 = *(undefined8 *)(*local_bc0 + 8);
    local_8e8._0_2_ = (short)uVar1;
    local_8e8._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_8e8._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_8e8._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_8e0._0_2_ = (short)uVar2;
    uStack_8e0._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_8e0._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_8e0._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_8e8._0_2_ = local_8d8 + (short)local_8e8;
    local_8e8._2_2_ = sStack_8d6 + local_8e8._2_2_;
    local_8e8._4_2_ = sStack_8d4 + local_8e8._4_2_;
    local_8e8._6_2_ = sStack_8d2 + local_8e8._6_2_;
    uStack_8e0._0_2_ = sStack_8d0 + (short)uStack_8e0;
    uStack_8e0._2_2_ = sStack_8ce + uStack_8e0._2_2_;
    uStack_8e0._4_2_ = sStack_8cc + uStack_8e0._4_2_;
    uStack_8e0._6_2_ = sStack_8ca + uStack_8e0._6_2_;
    local_908 = *(undefined8 *)*local_bc0;
    uStack_900 = *(undefined8 *)(*local_bc0 + 8);
    local_8f8._0_2_ = (short)local_908;
    local_8f8._2_2_ = (short)((ulong)local_908 >> 0x10);
    local_8f8._4_2_ = (short)((ulong)local_908 >> 0x20);
    local_8f8._6_2_ = (short)((ulong)local_908 >> 0x30);
    uStack_8f0._0_2_ = (short)uStack_900;
    uStack_8f0._2_2_ = (short)((ulong)uStack_900 >> 0x10);
    uStack_8f0._4_2_ = (short)((ulong)uStack_900 >> 0x20);
    uStack_8f0._6_2_ = (short)((ulong)uStack_900 >> 0x30);
    local_918 = (short)local_8f8 * 2;
    sStack_916 = local_8f8._2_2_ * 2;
    sStack_914 = local_8f8._4_2_ * 2;
    sStack_912 = local_8f8._6_2_ * 2;
    sStack_910 = (short)uStack_8f0 * 2;
    sStack_90e = uStack_8f0._2_2_ * 2;
    sStack_90c = uStack_8f0._4_2_ * 2;
    sStack_90a = uStack_8f0._6_2_ * 2;
    lVar3 = (*local_bd8)[0];
    lVar4 = (*local_bd8)[1];
    local_928._0_2_ = (short)lVar3;
    local_928._2_2_ = (short)((ulong)lVar3 >> 0x10);
    local_928._4_2_ = (short)((ulong)lVar3 >> 0x20);
    local_928._6_2_ = (short)((ulong)lVar3 >> 0x30);
    uStack_920._0_2_ = (short)lVar4;
    uStack_920._2_2_ = (short)((ulong)lVar4 >> 0x10);
    uStack_920._4_2_ = (short)((ulong)lVar4 >> 0x20);
    uStack_920._6_2_ = (short)((ulong)lVar4 >> 0x30);
    local_938 = CONCAT26(local_8e8._6_2_,
                         CONCAT24(local_8e8._4_2_,CONCAT22(local_8e8._2_2_,(short)local_8e8)));
    uStack_930 = CONCAT26(uStack_8e0._6_2_,
                          CONCAT24(uStack_8e0._4_2_,CONCAT22(uStack_8e0._2_2_,(short)uStack_8e0)));
    local_948 = CONCAT26(sStack_912 + local_928._6_2_,
                         CONCAT24(sStack_914 + local_928._4_2_,
                                  CONCAT22(sStack_916 + local_928._2_2_,local_918 + (short)local_928
                                          )));
    uStack_940 = CONCAT26(sStack_90a + uStack_920._6_2_,
                          CONCAT24(sStack_90c + uStack_920._4_2_,
                                   CONCAT22(sStack_90e + uStack_920._2_2_,
                                            sStack_910 + (short)uStack_920)));
    local_d18 = CONCAT26((ushort)(local_8e8._6_2_ + sStack_912 + local_928._6_2_) >> 3,
                         CONCAT24((ushort)(local_8e8._4_2_ + sStack_914 + local_928._4_2_) >> 3,
                                  CONCAT22((ushort)(local_8e8._2_2_ + sStack_916 + local_928._2_2_)
                                           >> 3,(ushort)((short)local_8e8 +
                                                        local_918 + (short)local_928) >> 3)));
    uStack_d10 = CONCAT26((ushort)(uStack_8e0._6_2_ + sStack_90a + uStack_920._6_2_) >> 3,
                          CONCAT24((ushort)(uStack_8e0._4_2_ + sStack_90c + uStack_920._4_2_) >> 3,
                                   CONCAT22((ushort)(uStack_8e0._2_2_ +
                                                    sStack_90e + uStack_920._2_2_) >> 3,
                                            (ushort)((short)uStack_8e0 +
                                                    sStack_910 + (short)uStack_920) >> 3)));
    local_968 = (*local_bd8)[0];
    lStack_960 = (*local_bd8)[1];
    local_958._0_2_ = (short)local_968;
    local_958._2_2_ = (short)((ulong)local_968 >> 0x10);
    local_958._4_2_ = (short)((ulong)local_968 >> 0x20);
    local_958._6_2_ = (short)((ulong)local_968 >> 0x30);
    uStack_950._0_2_ = (short)lStack_960;
    uStack_950._2_2_ = (short)((ulong)lStack_960 >> 0x10);
    uStack_950._4_2_ = (short)((ulong)lStack_960 >> 0x20);
    uStack_950._6_2_ = (short)((ulong)lStack_960 >> 0x30);
    local_978 = (short)local_958 * 2;
    sStack_976 = local_958._2_2_ * 2;
    sStack_974 = local_958._4_2_ * 2;
    sStack_972 = local_958._6_2_ * 2;
    sStack_970 = (short)uStack_950 * 2;
    sStack_96e = uStack_950._2_2_ * 2;
    sStack_96c = uStack_950._4_2_ * 2;
    sStack_96a = uStack_950._6_2_ * 2;
    lVar5 = (*local_be0)[0];
    lVar6 = (*local_be0)[1];
    local_988._0_2_ = (short)lVar5;
    local_988._2_2_ = (short)((ulong)lVar5 >> 0x10);
    local_988._4_2_ = (short)((ulong)lVar5 >> 0x20);
    local_988._6_2_ = (short)((ulong)lVar5 >> 0x30);
    uStack_980._0_2_ = (short)lVar6;
    uStack_980._2_2_ = (short)((ulong)lVar6 >> 0x10);
    uStack_980._4_2_ = (short)((ulong)lVar6 >> 0x20);
    uStack_980._6_2_ = (short)((ulong)lVar6 >> 0x30);
    local_998 = CONCAT26(local_8e8._6_2_,
                         CONCAT24(local_8e8._4_2_,CONCAT22(local_8e8._2_2_,(short)local_8e8)));
    uStack_990 = CONCAT26(uStack_8e0._6_2_,
                          CONCAT24(uStack_8e0._4_2_,CONCAT22(uStack_8e0._2_2_,(short)uStack_8e0)));
    local_9a8 = CONCAT26(sStack_972 + local_988._6_2_,
                         CONCAT24(sStack_974 + local_988._4_2_,
                                  CONCAT22(sStack_976 + local_988._2_2_,local_978 + (short)local_988
                                          )));
    uStack_9a0 = CONCAT26(sStack_96a + uStack_980._6_2_,
                          CONCAT24(sStack_96c + uStack_980._4_2_,
                                   CONCAT22(sStack_96e + uStack_980._2_2_,
                                            sStack_970 + (short)uStack_980)));
    uVar32 = (short)local_8e8 + local_978 + (short)local_988;
    uVar35 = local_8e8._2_2_ + sStack_976 + local_988._2_2_;
    uVar36 = local_8e8._4_2_ + sStack_974 + local_988._4_2_;
    uVar37 = local_8e8._6_2_ + sStack_972 + local_988._6_2_;
    uVar38 = (short)uStack_8e0 + sStack_970 + (short)uStack_980;
    uVar40 = uStack_8e0._2_2_ + sStack_96e + uStack_980._2_2_;
    uVar41 = uStack_8e0._4_2_ + sStack_96c + uStack_980._4_2_;
    uVar42 = uStack_8e0._6_2_ + sStack_96a + uStack_980._6_2_;
    local_d28 = CONCAT26(uVar37 >> 3,CONCAT24(uVar36 >> 3,CONCAT22(uVar35 >> 3,uVar32 >> 3)));
    uStack_d20 = CONCAT26(uVar42 >> 3,CONCAT24(uVar41 >> 3,CONCAT22(uVar40 >> 3,uVar38 >> 3)));
    local_7d8 = CONCAT26(uVar37,CONCAT24(uVar36,CONCAT22(uVar35,uVar32)));
    uStack_7d0 = CONCAT26(uVar42,CONCAT24(uVar41,CONCAT22(uVar40,uVar38)));
    uVar7 = *(undefined8 *)*local_bc0;
    uVar8 = *(undefined8 *)(*local_bc0 + 8);
    local_7e8._0_2_ = (short)uVar7;
    local_7e8._2_2_ = (short)((ulong)uVar7 >> 0x10);
    local_7e8._4_2_ = (short)((ulong)uVar7 >> 0x20);
    local_7e8._6_2_ = (short)((ulong)uVar7 >> 0x30);
    uStack_7e0._0_2_ = (short)uVar8;
    uStack_7e0._2_2_ = (short)((ulong)uVar8 >> 0x10);
    uStack_7e0._4_2_ = (short)((ulong)uVar8 >> 0x20);
    uStack_7e0._6_2_ = (short)((ulong)uVar8 >> 0x30);
    local_7f8 = uVar32 - (short)local_7e8;
    sStack_7f6 = uVar35 - local_7e8._2_2_;
    sStack_7f4 = uVar36 - local_7e8._4_2_;
    sStack_7f2 = uVar37 - local_7e8._6_2_;
    sStack_7f0 = uVar38 - (short)uStack_7e0;
    sStack_7ee = uVar40 - uStack_7e0._2_2_;
    sStack_7ec = uVar41 - uStack_7e0._4_2_;
    sStack_7ea = uVar42 - uStack_7e0._6_2_;
    uVar9 = *(undefined8 *)*local_bc8;
    uVar10 = *(undefined8 *)(*local_bc8 + 8);
    local_808._0_2_ = (short)uVar9;
    local_808._2_2_ = (short)((ulong)uVar9 >> 0x10);
    local_808._4_2_ = (short)((ulong)uVar9 >> 0x20);
    local_808._6_2_ = (short)((ulong)uVar9 >> 0x30);
    uStack_800._0_2_ = (short)uVar10;
    uStack_800._2_2_ = (short)((ulong)uVar10 >> 0x10);
    uStack_800._4_2_ = (short)((ulong)uVar10 >> 0x20);
    uStack_800._6_2_ = (short)((ulong)uVar10 >> 0x30);
    lVar11 = (*local_be0)[0];
    lVar12 = (*local_be0)[1];
    lVar13 = (*local_be8)[0];
    lVar14 = (*local_be8)[1];
    local_9b8._0_2_ = (short)lVar11;
    local_9b8._2_2_ = (short)((ulong)lVar11 >> 0x10);
    local_9b8._4_2_ = (short)((ulong)lVar11 >> 0x20);
    local_9b8._6_2_ = (short)((ulong)lVar11 >> 0x30);
    uStack_9b0._0_2_ = (short)lVar12;
    uStack_9b0._2_2_ = (short)((ulong)lVar12 >> 0x10);
    uStack_9b0._4_2_ = (short)((ulong)lVar12 >> 0x20);
    uStack_9b0._6_2_ = (short)((ulong)lVar12 >> 0x30);
    local_9c8._0_2_ = (short)lVar13;
    local_9c8._2_2_ = (short)((ulong)lVar13 >> 0x10);
    local_9c8._4_2_ = (short)((ulong)lVar13 >> 0x20);
    local_9c8._6_2_ = (short)((ulong)lVar13 >> 0x30);
    uStack_9c0._0_2_ = (short)lVar14;
    uStack_9c0._2_2_ = (short)((ulong)lVar14 >> 0x10);
    uStack_9c0._4_2_ = (short)((ulong)lVar14 >> 0x20);
    uStack_9c0._6_2_ = (short)((ulong)lVar14 >> 0x30);
    local_9d8 = CONCAT26(sStack_7f2 - local_808._6_2_,
                         CONCAT24(sStack_7f4 - local_808._4_2_,
                                  CONCAT22(sStack_7f6 - local_808._2_2_,local_7f8 - (short)local_808
                                          )));
    uStack_9d0 = CONCAT26(sStack_7ea - uStack_800._6_2_,
                          CONCAT24(sStack_7ec - uStack_800._4_2_,
                                   CONCAT22(sStack_7ee - uStack_800._2_2_,
                                            sStack_7f0 - (short)uStack_800)));
    local_9e8 = CONCAT26(local_9b8._6_2_ + local_9c8._6_2_,
                         CONCAT24(local_9b8._4_2_ + local_9c8._4_2_,
                                  CONCAT22(local_9b8._2_2_ + local_9c8._2_2_,
                                           (short)local_9b8 + (short)local_9c8)));
    uStack_9e0 = CONCAT26(uStack_9b0._6_2_ + uStack_9c0._6_2_,
                          CONCAT24(uStack_9b0._4_2_ + uStack_9c0._4_2_,
                                   CONCAT22(uStack_9b0._2_2_ + uStack_9c0._2_2_,
                                            (short)uStack_9b0 + (short)uStack_9c0)));
    local_e28 = (local_7f8 - (short)local_808) + (short)local_9b8 + (short)local_9c8;
    uStack_e26 = (sStack_7f6 - local_808._2_2_) + local_9b8._2_2_ + local_9c8._2_2_;
    uStack_e24 = (sStack_7f4 - local_808._4_2_) + local_9b8._4_2_ + local_9c8._4_2_;
    uStack_e22 = (sStack_7f2 - local_808._6_2_) + local_9b8._6_2_ + local_9c8._6_2_;
    uStack_e20 = (sStack_7f0 - (short)uStack_800) + (short)uStack_9b0 + (short)uStack_9c0;
    uStack_e1e = (sStack_7ee - uStack_800._2_2_) + uStack_9b0._2_2_ + uStack_9c0._2_2_;
    uStack_e1c = (sStack_7ec - uStack_800._4_2_) + uStack_9b0._4_2_ + uStack_9c0._4_2_;
    uStack_e1a = (sStack_7ea - uStack_800._6_2_) + uStack_9b0._6_2_ + uStack_9c0._6_2_;
    local_d38 = CONCAT26(uStack_e22 >> 3,
                         CONCAT24(uStack_e24 >> 3,CONCAT22(uStack_e26 >> 3,local_e28 >> 3)));
    uStack_d30 = CONCAT26(uStack_e1a >> 3,
                          CONCAT24(uStack_e1c >> 3,CONCAT22(uStack_e1e >> 3,uStack_e20 >> 3)));
    local_818 = CONCAT26(uStack_e22,CONCAT24(uStack_e24,CONCAT22(uStack_e26,local_e28)));
    uStack_810 = CONCAT26(uStack_e1a,CONCAT24(uStack_e1c,CONCAT22(uStack_e1e,uStack_e20)));
    uVar15 = *(undefined8 *)*local_bc8;
    uVar16 = *(undefined8 *)(*local_bc8 + 8);
    local_828._0_2_ = (short)uVar15;
    local_828._2_2_ = (short)((ulong)uVar15 >> 0x10);
    local_828._4_2_ = (short)((ulong)uVar15 >> 0x20);
    local_828._6_2_ = (short)((ulong)uVar15 >> 0x30);
    uStack_820._0_2_ = (short)uVar16;
    uStack_820._2_2_ = (short)((ulong)uVar16 >> 0x10);
    uStack_820._4_2_ = (short)((ulong)uVar16 >> 0x20);
    uStack_820._6_2_ = (short)((ulong)uVar16 >> 0x30);
    local_838 = local_e28 - (short)local_828;
    sStack_836 = uStack_e26 - local_828._2_2_;
    sStack_834 = uStack_e24 - local_828._4_2_;
    sStack_832 = uStack_e22 - local_828._6_2_;
    sStack_830 = uStack_e20 - (short)uStack_820;
    sStack_82e = uStack_e1e - uStack_820._2_2_;
    sStack_82c = uStack_e1c - uStack_820._4_2_;
    sStack_82a = uStack_e1a - uStack_820._6_2_;
    uVar17 = *(undefined8 *)*local_bd0;
    uVar18 = *(undefined8 *)(*local_bd0 + 8);
    local_848._0_2_ = (short)uVar17;
    local_848._2_2_ = (short)((ulong)uVar17 >> 0x10);
    local_848._4_2_ = (short)((ulong)uVar17 >> 0x20);
    local_848._6_2_ = (short)((ulong)uVar17 >> 0x30);
    uStack_840._0_2_ = (short)uVar18;
    uStack_840._2_2_ = (short)((ulong)uVar18 >> 0x10);
    uStack_840._4_2_ = (short)((ulong)uVar18 >> 0x20);
    uStack_840._6_2_ = (short)((ulong)uVar18 >> 0x30);
    local_e08 = local_838 - (short)local_848;
    sStack_e06 = sStack_836 - local_848._2_2_;
    sStack_e04 = sStack_834 - local_848._4_2_;
    sStack_e02 = sStack_832 - local_848._6_2_;
    sStack_e00 = sStack_830 - (short)uStack_840;
    sStack_dfe = sStack_82e - uStack_840._2_2_;
    sStack_dfc = sStack_82c - uStack_840._4_2_;
    sStack_dfa = sStack_82a - uStack_840._6_2_;
    local_a08 = (*local_be8)[0];
    lStack_a00 = (*local_be8)[1];
    local_9f8._0_2_ = (short)local_a08;
    local_9f8._2_2_ = (short)((ulong)local_a08 >> 0x10);
    local_9f8._4_2_ = (short)((ulong)local_a08 >> 0x20);
    local_9f8._6_2_ = (short)((ulong)local_a08 >> 0x30);
    uStack_9f0._0_2_ = (short)lStack_a00;
    uStack_9f0._2_2_ = (short)((ulong)lStack_a00 >> 0x10);
    uStack_9f0._4_2_ = (short)((ulong)lStack_a00 >> 0x20);
    uStack_9f0._6_2_ = (short)((ulong)lStack_a00 >> 0x30);
    local_e18 = (short)local_9f8 * 2;
    sStack_e16 = local_9f8._2_2_ * 2;
    sStack_e14 = local_9f8._4_2_ * 2;
    sStack_e12 = local_9f8._6_2_ * 2;
    sStack_e10 = (short)uStack_9f0 * 2;
    sStack_e0e = uStack_9f0._2_2_ * 2;
    sStack_e0c = uStack_9f0._4_2_ * 2;
    sStack_e0a = uStack_9f0._6_2_ * 2;
    local_a18 = CONCAT26(sStack_e02,CONCAT24(sStack_e04,CONCAT22(sStack_e06,local_e08)));
    uStack_a10 = CONCAT26(sStack_dfa,CONCAT24(sStack_dfc,CONCAT22(sStack_dfe,sStack_e00)));
    local_a28 = CONCAT26(sStack_e12,CONCAT24(sStack_e14,CONCAT22(sStack_e16,local_e18)));
    uStack_a20 = CONCAT26(sStack_e0a,CONCAT24(sStack_e0c,CONCAT22(sStack_e0e,sStack_e10)));
    local_e38 = local_e08 + local_e18;
    uStack_e36 = sStack_e06 + sStack_e16;
    uStack_e34 = sStack_e04 + sStack_e14;
    uStack_e32 = sStack_e02 + sStack_e12;
    uStack_e30 = sStack_e00 + sStack_e10;
    uStack_e2e = sStack_dfe + sStack_e0e;
    uStack_e2c = sStack_dfc + sStack_e0c;
    uStack_e2a = sStack_dfa + sStack_e0a;
    local_d48 = CONCAT26(uStack_e32 >> 3,
                         CONCAT24(uStack_e34 >> 3,CONCAT22(uStack_e36 >> 3,local_e38 >> 3)));
    uStack_d40 = CONCAT26(uStack_e2a >> 3,
                          CONCAT24(uStack_e2c >> 3,CONCAT22(uStack_e2e >> 3,uStack_e30 >> 3)));
    local_db8 = ~local_c98 & local_db8;
    uStack_db0 = ~uStack_c90 & uStack_db0;
    local_b48 = local_d38;
    uStack_b40 = uStack_d30;
    local_d38 = local_c98 & local_d38;
    uStack_d30 = uStack_c90 & uStack_d30;
    uVar33 = uStack_db0 | uStack_d30;
    local_b38 = local_c98;
    uStack_b30 = uStack_c90;
    local_9f8 = local_a08;
    uStack_9f0 = lStack_a00;
    local_9c8 = lVar13;
    uStack_9c0 = lVar14;
    local_9b8 = lVar11;
    uStack_9b0 = lVar12;
    local_988 = lVar5;
    uStack_980 = lVar6;
    local_958 = local_968;
    uStack_950 = lStack_960;
    local_928 = lVar3;
    uStack_920 = lVar4;
    local_8f8 = local_908;
    uStack_8f0 = uStack_900;
    local_8e8 = uVar1;
    uStack_8e0 = uVar2;
    local_8c8 = uVar30;
    uStack_8c0 = uVar31;
    local_878 = local_888;
    uStack_870 = uStack_880;
    local_858 = local_868;
    uStack_850 = uStack_860;
    local_848 = uVar17;
    uStack_840 = uVar18;
    local_828 = uVar15;
    uStack_820 = uVar16;
    local_808 = uVar9;
    uStack_800 = uVar10;
    local_7e8 = uVar7;
    uStack_7e0 = uVar8;
    (*local_bd8)[0] = local_db8 | local_d38;
    (*palVar28)[1] = uVar33;
    palVar28 = local_be0;
    local_da8 = ~local_c98 & local_da8;
    uStack_da0 = ~uStack_c90 & uStack_da0;
    local_b58 = local_c98;
    uStack_b50 = uStack_c90;
    local_b68 = local_d48;
    uStack_b60 = uStack_d40;
    local_d48 = local_c98 & local_d48;
    uStack_d40 = uStack_c90 & uStack_d40;
    uVar33 = uStack_da0 | uStack_d40;
    (*local_be0)[0] = local_da8 | local_d48;
    (*palVar28)[1] = uVar33;
    pauVar29 = local_bd0;
    local_d98 = ~local_c98 & local_d98;
    uStack_d90 = ~uStack_c90 & uStack_d90;
    local_b78 = local_c98;
    uStack_b70 = uStack_c90;
    local_b88 = local_d28;
    uStack_b80 = uStack_d20;
    local_d28 = local_c98 & local_d28;
    uStack_d20 = uStack_c90 & uStack_d20;
    uVar33 = uStack_d90 | uStack_d20;
    *(ulong *)*local_bd0 = local_d98 | local_d28;
    *(ulong *)(*pauVar29 + 8) = uVar33;
    pauVar29 = local_bc8;
    local_718 = (uint)local_c98;
    uStack_714 = (uint)(local_c98 >> 0x20);
    uStack_710 = (uint)uStack_c90;
    uStack_70c = (uint)(uStack_c90 >> 0x20);
    local_d88 = (local_718 ^ 0xffffffff) & local_d88;
    uStack_d84 = (uStack_714 ^ 0xffffffff) & uStack_d84;
    uStack_d80 = (uStack_710 ^ 0xffffffff) & uStack_d80;
    uStack_d7c = (uStack_70c ^ 0xffffffff) & uStack_d7c;
    local_b98 = local_c98;
    uStack_b90 = uStack_c90;
    local_ba8 = local_d18;
    uStack_ba0 = uStack_d10;
    local_d18 = local_c98 & local_d18;
    uStack_d10 = uStack_c90 & uStack_d10;
    uVar33 = CONCAT44(uStack_d7c,uStack_d80) | uStack_d10;
    *(ulong *)*local_bc8 = CONCAT44(uStack_d84,local_d88) | local_d18;
    *(ulong *)(*pauVar29 + 8) = uVar33;
  }
  highbd_transpose4x8_8x4_sse2
            (x3_00,x4_00,&local_1028,&local_1018,&local_1008,&local_ff8,x1_00,d3_00,d4_00,d5_00,
             (__m128i *)CONCAT26(uVar45,CONCAT24(uVar44,in_stack_ffffffffffffeee0)),t80_out);
  *(undefined8 *)(local_f80 + -4) = local_fb8;
  *(undefined8 *)(local_f80 + -4 + (long)local_f84 * 2) = local_fc8;
  *(undefined8 *)(local_f80 + -4 + (long)(local_f84 * 2) * 2) = local_fd8;
  *(undefined8 *)(local_f80 + -4 + (long)(local_f84 * 3) * 2) = local_fe8;
  *(longlong *)(local_f80 + -4 + (long)(local_f84 << 2) * 2) = local_ff8[0];
  *(longlong *)(local_f80 + -4 + (long)(local_f84 * 5) * 2) = local_1008[0];
  *(longlong *)(local_f80 + -4 + (long)(local_f84 * 6) * 2) = local_1018[0];
  *(longlong *)(local_f80 + -4 + (long)(local_f84 * 7) * 2) = local_1028[0];
  return;
}

Assistant:

void aom_highbd_lpf_vertical_6_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i p0, q0, p1, q1, p2, q2;

  x0 = _mm_loadu_si128((__m128i *)((s - 3) + 0 * p));
  x1 = _mm_loadu_si128((__m128i *)((s - 3) + 1 * p));
  x2 = _mm_loadu_si128((__m128i *)((s - 3) + 2 * p));
  x3 = _mm_loadu_si128((__m128i *)((s - 3) + 3 * p));
  x4 = _mm_loadu_si128((__m128i *)((s - 3) + 4 * p));
  x5 = _mm_loadu_si128((__m128i *)((s - 3) + 5 * p));
  x6 = _mm_loadu_si128((__m128i *)((s - 3) + 6 * p));
  x7 = _mm_loadu_si128((__m128i *)((s - 3) + 7 * p));

  highbd_transpose8x8_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &p2, &p1,
                           &p0, &q0, &q1, &q2, &d6, &d7);

  highbd_lpf_internal_6_dual_sse2(&p2, &p1, &p0, &q0, &q1, &q2, _blimit0,
                                  _limit0, _thresh0, _blimit1, _limit1,
                                  _thresh1, bd);

  highbd_transpose4x8_8x4_sse2(&p1, &p0, &q0, &q1, &d0, &d1, &d2, &d3, &d4, &d5,
                               &d6, &d7);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
  _mm_storel_epi64((__m128i *)(s - 2 + 4 * p), d4);
  _mm_storel_epi64((__m128i *)(s - 2 + 5 * p), d5);
  _mm_storel_epi64((__m128i *)(s - 2 + 6 * p), d6);
  _mm_storel_epi64((__m128i *)(s - 2 + 7 * p), d7);
}